

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_iflist.c
# Opt level: O3

csp_iface_t * csp_iflist_get_by_isdfl(csp_iface_t *ifc)

{
  csp_iface_t *pcVar1;
  csp_iface_s **ppcVar2;
  
  ppcVar2 = &interfaces;
  if (ifc != (csp_iface_t *)0x0) {
    ppcVar2 = &ifc->next;
  }
  pcVar1 = *ppcVar2;
  while( true ) {
    if (pcVar1 == (csp_iface_t *)0x0) {
      return (csp_iface_t *)0x0;
    }
    if (pcVar1->is_default == '\x01') break;
    pcVar1 = pcVar1->next;
  }
  return pcVar1;
}

Assistant:

csp_iface_t * csp_iflist_get_by_isdfl(csp_iface_t * ifc) {

	/* Head of list */
	if (ifc == NULL) {
		ifc = interfaces;

	/* Otherwise, continue from user defined ifc */
	} else {
		ifc = ifc->next;
	}

	while (ifc) {

		if (ifc->is_default == 1) {
			return ifc;
		}

		ifc = ifc->next;
		continue;

	}

	return NULL;

}